

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings_tests.cpp
# Opt level: O0

void __thiscall
blockencodings_tests::SufficientPreforwardRTTest::test_method(SufficientPreforwardRTTest *this)

{
  bool bVar1;
  undefined1 uVar2;
  type pCVar3;
  PartiallyDownloadedBlock *pPVar4;
  uint256 *puVar5;
  uint64_t uVar6;
  reference pvVar7;
  CTxMemPool *this_00;
  long in_FS_OFFSET;
  CTxMemPool *pool;
  bool mutated;
  DataStream stream;
  TestMemPoolEntryHelper entry;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  PartiallyDownloadedBlock partialBlockCopy;
  CBlock block2;
  PartiallyDownloadedBlock partialBlock;
  CBlockHeaderAndShortTxIDs shortIDs2;
  TestHeaderAndShortIDs shortIDs;
  uint256 txhash;
  CBlock block;
  FastRandomContext rand_ctx;
  char *in_stack_fffffffffffff188;
  CBlockHeaderAndShortTxIDs *in_stack_fffffffffffff190;
  char *in_stack_fffffffffffff198;
  PartiallyDownloadedBlock *in_stack_fffffffffffff1a0;
  undefined4 in_stack_fffffffffffff1a8;
  int in_stack_fffffffffffff1ac;
  undefined7 in_stack_fffffffffffff1b0;
  undefined1 in_stack_fffffffffffff1b7;
  PartiallyDownloadedBlock *in_stack_fffffffffffff1b8;
  CTxMemPoolEntry *in_stack_fffffffffffff1c0;
  const_string *pcVar8;
  undefined7 in_stack_fffffffffffff1c8;
  undefined1 in_stack_fffffffffffff1cf;
  CTxMemPool *in_stack_fffffffffffff1d0;
  CTransactionRef *in_stack_fffffffffffff1d8;
  TestMemPoolEntryHelper *in_stack_fffffffffffff1e0;
  CBlock *in_stack_fffffffffffff1e8;
  FastRandomContext *in_stack_fffffffffffff240;
  undefined7 in_stack_fffffffffffff290;
  type cmpctblock;
  undefined1 local_c18 [136];
  pointer local_b90;
  undefined1 local_b88 [16];
  undefined1 local_b78 [64];
  const_string local_b38 [2];
  lazy_ostream local_b18 [2];
  assertion_result local_af8 [2];
  undefined1 local_ac0 [16];
  undefined1 local_ab0 [72];
  undefined1 local_a68 [16];
  undefined1 local_a58 [64];
  const_string local_a18 [2];
  lazy_ostream local_9f8 [2];
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  assertion_result local_9c0 [2];
  undefined1 local_988 [144];
  lazy_ostream local_8f8 [2];
  assertion_result local_8d8 [2];
  const_string local_8a0 [2];
  lazy_ostream local_880 [2];
  assertion_result local_860 [2];
  const_string local_828 [2];
  lazy_ostream local_808 [2];
  assertion_result local_7e8 [2];
  const_string local_7b0 [2];
  lazy_ostream local_790 [2];
  assertion_result local_770 [2];
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined2 local_710;
  undefined2 local_6f8;
  CBlockHeaderAndShortTxIDs local_6e0;
  undefined1 local_5f0 [160];
  undefined1 local_550 [768];
  undefined8 local_250;
  undefined8 local_248;
  undefined8 local_240;
  undefined8 local_238;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  inline_assertion_check<true,std::unique_ptr<CTxMemPool,std::default_delete<CTxMemPool>>&>
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)
             CONCAT17(in_stack_fffffffffffff1cf,in_stack_fffffffffffff1c8),
             (char *)in_stack_fffffffffffff1c0,(int)((ulong)in_stack_fffffffffffff1b8 >> 0x20),
             (char *)CONCAT17(in_stack_fffffffffffff1b7,in_stack_fffffffffffff1b0),
             (char *)CONCAT44(in_stack_fffffffffffff1ac,in_stack_fffffffffffff1a8));
  pCVar3 = std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
                     ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)
                      in_stack_fffffffffffff198);
  TestMemPoolEntryHelper::TestMemPoolEntryHelper
            ((TestMemPoolEntryHelper *)in_stack_fffffffffffff188);
  uint256::uint256((uint256 *)in_stack_fffffffffffff188,'\0');
  FastRandomContext::FastRandomContext
            ((FastRandomContext *)CONCAT44(in_stack_fffffffffffff1ac,in_stack_fffffffffffff1a8),
             (uint256 *)in_stack_fffffffffffff1a0);
  BuildBlockTestCase(in_stack_fffffffffffff240);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff188);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_fffffffffffff1cf,in_stack_fffffffffffff1c8),
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff1c0,
             (char *)in_stack_fffffffffffff1b8,
             (char *)CONCAT17(in_stack_fffffffffffff1b7,in_stack_fffffffffffff1b0),
             in_stack_fffffffffffff1ac,SUB41((uint)in_stack_fffffffffffff1a8 >> 0x18,0));
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff188);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_fffffffffffff1cf,in_stack_fffffffffffff1c8),
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff1c0,
             (char *)in_stack_fffffffffffff1b8,
             (char *)CONCAT17(in_stack_fffffffffffff1b7,in_stack_fffffffffffff1b0),
             in_stack_fffffffffffff1ac,SUB41((uint)in_stack_fffffffffffff1a8 >> 0x18,0));
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_fffffffffffff198,(size_type)in_stack_fffffffffffff190);
  TestMemPoolEntryHelper::FromTx(in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8);
  CTxMemPool::addUnchecked
            ((CTxMemPool *)CONCAT17(in_stack_fffffffffffff1cf,in_stack_fffffffffffff1c8),
             in_stack_fffffffffffff1c0);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_fffffffffffff188);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff198,
               (pointer)in_stack_fffffffffffff190,(unsigned_long)in_stack_fffffffffffff188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff1cf,in_stack_fffffffffffff1c8),
               (const_string *)in_stack_fffffffffffff1c0,(size_t)in_stack_fffffffffffff1b8,
               (const_string *)CONCAT17(in_stack_fffffffffffff1b7,in_stack_fffffffffffff1b0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff190,(char (*) [1])in_stack_fffffffffffff188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff198,
               (pointer)in_stack_fffffffffffff190,(unsigned_long)in_stack_fffffffffffff188);
    cmpctblock = pCVar3;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)in_stack_fffffffffffff198,(size_type)in_stack_fffffffffffff190);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffff188);
    pPVar4 = (PartiallyDownloadedBlock *)
             CTransaction::GetHash((CTransaction *)in_stack_fffffffffffff188);
    puVar5 = transaction_identifier::operator_cast_to_uint256_
                       ((transaction_identifier<false> *)in_stack_fffffffffffff188);
    CTxMemPool::get(in_stack_fffffffffffff1d0,
                    (uint256 *)CONCAT17(in_stack_fffffffffffff1cf,in_stack_fffffffffffff1c8));
    local_6e0.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::use_count
                            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                             in_stack_fffffffffffff188);
    local_6e0.shorttxidk0 = 4;
    in_stack_fffffffffffff198 = "SHARED_TX_OFFSET + 0";
    in_stack_fffffffffffff190 = &local_6e0;
    in_stack_fffffffffffff188 = "pool.get(block.vtx[1]->GetHash()).use_count()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&local_6e0.prefilledtxn,
               &local_6e0.shorttxids.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish,0xe2,1,2,&local_6e0.shorttxids);
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffff188);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff188);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  uint256::uint256((uint256 *)in_stack_fffffffffffff188);
  TestHeaderAndShortIDs::TestHeaderAndShortIDs
            ((TestHeaderAndShortIDs *)in_stack_fffffffffffff1c0,(CBlock *)in_stack_fffffffffffff1b8,
             (FastRandomContext *)CONCAT17(in_stack_fffffffffffff1b7,in_stack_fffffffffffff1b0));
  std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>::resize
            ((vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_> *)
             CONCAT44(in_stack_fffffffffffff1ac,in_stack_fffffffffffff1a8),
             (size_type)in_stack_fffffffffffff1a0);
  local_6f8 = 0;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_fffffffffffff198,(size_type)in_stack_fffffffffffff190);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffff188,
             (shared_ptr<const_CTransaction> *)0x433578);
  std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>::operator[]
            ((vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_> *)
             in_stack_fffffffffffff198,(size_type)in_stack_fffffffffffff190);
  PrefilledTransaction::operator=
            ((PrefilledTransaction *)in_stack_fffffffffffff198,
             (PrefilledTransaction *)in_stack_fffffffffffff190);
  PrefilledTransaction::~PrefilledTransaction((PrefilledTransaction *)in_stack_fffffffffffff188);
  local_710 = 1;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_fffffffffffff198,(size_type)in_stack_fffffffffffff190);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffff188,
             (shared_ptr<const_CTransaction> *)0x4335f6);
  std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>::operator[]
            ((vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_> *)
             in_stack_fffffffffffff198,(size_type)in_stack_fffffffffffff190);
  PrefilledTransaction::operator=
            ((PrefilledTransaction *)in_stack_fffffffffffff198,
             (PrefilledTransaction *)in_stack_fffffffffffff190);
  PrefilledTransaction::~PrefilledTransaction((PrefilledTransaction *)in_stack_fffffffffffff188);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_fffffffffffff1ac,in_stack_fffffffffffff1a8),
             (size_type)in_stack_fffffffffffff1a0);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_fffffffffffff198,(size_type)in_stack_fffffffffffff190);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffff188);
  CTransaction::GetWitnessHash((CTransaction *)in_stack_fffffffffffff188);
  uVar6 = TestHeaderAndShortIDs::GetShortID
                    ((TestHeaderAndShortIDs *)in_stack_fffffffffffff1b8,
                     (Wtxid *)CONCAT17(in_stack_fffffffffffff1b7,in_stack_fffffffffffff1b0));
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_fffffffffffff198,(size_type)in_stack_fffffffffffff190);
  *pvVar7 = uVar6;
  local_728 = 0;
  uStack_720 = 0;
  local_738 = 0;
  uStack_730 = 0;
  DataStream::DataStream((DataStream *)in_stack_fffffffffffff188);
  DataStream::operator<<
            ((DataStream *)in_stack_fffffffffffff198,
             (TestHeaderAndShortIDs *)in_stack_fffffffffffff190);
  CBlockHeaderAndShortTxIDs::CBlockHeaderAndShortTxIDs
            ((CBlockHeaderAndShortTxIDs *)in_stack_fffffffffffff1b8);
  DataStream::operator>>((DataStream *)in_stack_fffffffffffff198,in_stack_fffffffffffff190);
  PartiallyDownloadedBlock::PartiallyDownloadedBlock
            (in_stack_fffffffffffff1b8,
             (CTxMemPool *)CONCAT17(in_stack_fffffffffffff1b7,in_stack_fffffffffffff1b0));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff198,
               (pointer)in_stack_fffffffffffff190,(unsigned_long)in_stack_fffffffffffff188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff1cf,in_stack_fffffffffffff1c8),
               (const_string *)in_stack_fffffffffffff1c0,(size_t)in_stack_fffffffffffff1b8,
               (const_string *)CONCAT17(in_stack_fffffffffffff1b7,in_stack_fffffffffffff1b0));
    PartiallyDownloadedBlock::InitData
              (pPVar4,(CBlockHeaderAndShortTxIDs *)cmpctblock,
               (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)puVar5);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff198,
               SUB81((ulong)in_stack_fffffffffffff190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff198,
               (pointer)in_stack_fffffffffffff190,(unsigned_long)in_stack_fffffffffffff188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff190,
               (basic_cstring<const_char> *)in_stack_fffffffffffff188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff198,
               (pointer)in_stack_fffffffffffff190,(unsigned_long)in_stack_fffffffffffff188);
    in_stack_fffffffffffff188 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_770,local_790,local_7b0,0xf6,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff188);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff198,
               (pointer)in_stack_fffffffffffff190,(unsigned_long)in_stack_fffffffffffff188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff1cf,in_stack_fffffffffffff1c8),
               (const_string *)in_stack_fffffffffffff1c0,(size_t)in_stack_fffffffffffff1b8,
               (const_string *)CONCAT17(in_stack_fffffffffffff1b7,in_stack_fffffffffffff1b0));
    PartiallyDownloadedBlock::IsTxAvailable
              (in_stack_fffffffffffff1a0,(size_t)in_stack_fffffffffffff198);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff198,
               SUB81((ulong)in_stack_fffffffffffff190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff198,
               (pointer)in_stack_fffffffffffff190,(unsigned_long)in_stack_fffffffffffff188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff190,
               (basic_cstring<const_char> *)in_stack_fffffffffffff188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff198,
               (pointer)in_stack_fffffffffffff190,(unsigned_long)in_stack_fffffffffffff188);
    in_stack_fffffffffffff188 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_7e8,local_808,local_828,0xf7,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff188);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff198,
               (pointer)in_stack_fffffffffffff190,(unsigned_long)in_stack_fffffffffffff188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff1cf,in_stack_fffffffffffff1c8),
               (const_string *)in_stack_fffffffffffff1c0,(size_t)in_stack_fffffffffffff1b8,
               (const_string *)CONCAT17(in_stack_fffffffffffff1b7,in_stack_fffffffffffff1b0));
    PartiallyDownloadedBlock::IsTxAvailable
              (in_stack_fffffffffffff1a0,(size_t)in_stack_fffffffffffff198);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff198,
               SUB81((ulong)in_stack_fffffffffffff190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff198,
               (pointer)in_stack_fffffffffffff190,(unsigned_long)in_stack_fffffffffffff188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff190,
               (basic_cstring<const_char> *)in_stack_fffffffffffff188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff198,
               (pointer)in_stack_fffffffffffff190,(unsigned_long)in_stack_fffffffffffff188);
    in_stack_fffffffffffff188 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_860,local_880,local_8a0,0xf8,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff188);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff198,
               (pointer)in_stack_fffffffffffff190,(unsigned_long)in_stack_fffffffffffff188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff1cf,in_stack_fffffffffffff1c8),
               (const_string *)in_stack_fffffffffffff1c0,(size_t)in_stack_fffffffffffff1b8,
               (const_string *)CONCAT17(in_stack_fffffffffffff1b7,in_stack_fffffffffffff1b0));
    PartiallyDownloadedBlock::IsTxAvailable
              (in_stack_fffffffffffff1a0,(size_t)in_stack_fffffffffffff198);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff198,
               SUB81((ulong)in_stack_fffffffffffff190 >> 0x38,0));
    pPVar4 = (PartiallyDownloadedBlock *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff198,
               (pointer)in_stack_fffffffffffff190,(unsigned_long)in_stack_fffffffffffff188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff190,
               (basic_cstring<const_char> *)in_stack_fffffffffffff188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff198,
               (pointer)in_stack_fffffffffffff190,(unsigned_long)in_stack_fffffffffffff188);
    in_stack_fffffffffffff188 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_8d8,local_8f8,(const_string *)(local_988 + 0x70),0xf9,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff188);
    uVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar2);
  do {
    pcVar8 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff198,
               (pointer)in_stack_fffffffffffff190,(unsigned_long)in_stack_fffffffffffff188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff1cf,in_stack_fffffffffffff1c8),
               (const_string *)in_stack_fffffffffffff1c0,(size_t)in_stack_fffffffffffff1b8,
               (const_string *)CONCAT17(in_stack_fffffffffffff1b7,in_stack_fffffffffffff1b0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff190,(char (*) [1])in_stack_fffffffffffff188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff198,
               (pointer)in_stack_fffffffffffff190,(unsigned_long)in_stack_fffffffffffff188);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)in_stack_fffffffffffff198,(size_type)in_stack_fffffffffffff190);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffff188);
    CTransaction::GetHash((CTransaction *)in_stack_fffffffffffff188);
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)in_stack_fffffffffffff188);
    CTxMemPool::get(in_stack_fffffffffffff1d0,
                    (uint256 *)CONCAT17(in_stack_fffffffffffff1cf,in_stack_fffffffffffff1c8));
    local_988._24_8_ =
         std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::use_count
                   ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                    in_stack_fffffffffffff188);
    local_988._0_8_ = 5;
    in_stack_fffffffffffff198 = "SHARED_TX_OFFSET + 1";
    in_stack_fffffffffffff190 = (CBlockHeaderAndShortTxIDs *)local_988;
    in_stack_fffffffffffff188 = "pool.get(block.vtx[1]->GetHash()).use_count()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_988 + 0x30,local_988 + 0x20,0xfb,1,2,local_988 + 0x18);
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffff188);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff188);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CBlock::CBlock((CBlock *)CONCAT44(in_stack_fffffffffffff1ac,in_stack_fffffffffffff1a8));
  PartiallyDownloadedBlock::PartiallyDownloadedBlock
            ((PartiallyDownloadedBlock *)
             CONCAT44(in_stack_fffffffffffff1ac,in_stack_fffffffffffff1a8),in_stack_fffffffffffff1a0
            );
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff198,
               (pointer)in_stack_fffffffffffff190,(unsigned_long)in_stack_fffffffffffff188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff1cf,in_stack_fffffffffffff1c8),
               (const_string *)in_stack_fffffffffffff1c0,(size_t)in_stack_fffffffffffff1b8,
               (const_string *)CONCAT17(in_stack_fffffffffffff1b7,in_stack_fffffffffffff1b0));
    local_9d8 = 0;
    uStack_9d0 = 0;
    local_9c8 = 0;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)in_stack_fffffffffffff188);
    PartiallyDownloadedBlock::FillBlock
              (pPVar4,(CBlock *)CONCAT17(uVar2,in_stack_fffffffffffff290),
               (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)pcVar8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff198,
               SUB81((ulong)in_stack_fffffffffffff190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff198,
               (pointer)in_stack_fffffffffffff190,(unsigned_long)in_stack_fffffffffffff188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff190,
               (basic_cstring<const_char> *)in_stack_fffffffffffff188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff198,
               (pointer)in_stack_fffffffffffff190,(unsigned_long)in_stack_fffffffffffff188);
    in_stack_fffffffffffff188 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_9c0,local_9f8,local_a18,0xff,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff188);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)in_stack_fffffffffffff198);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff198,
               (pointer)in_stack_fffffffffffff190,(unsigned_long)in_stack_fffffffffffff188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff1cf,in_stack_fffffffffffff1c8),
               (const_string *)in_stack_fffffffffffff1c0,(size_t)in_stack_fffffffffffff1b8,
               (const_string *)CONCAT17(in_stack_fffffffffffff1b7,in_stack_fffffffffffff1b0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff190,(char (*) [1])in_stack_fffffffffffff188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff198,
               (pointer)in_stack_fffffffffffff190,(unsigned_long)in_stack_fffffffffffff188);
    CBlockHeader::GetHash
              ((CBlockHeader *)CONCAT44(in_stack_fffffffffffff1ac,in_stack_fffffffffffff1a8));
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff190);
    CBlockHeader::GetHash
              ((CBlockHeader *)CONCAT44(in_stack_fffffffffffff1ac,in_stack_fffffffffffff1a8));
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff190);
    in_stack_fffffffffffff198 = "block2.GetHash().ToString()";
    in_stack_fffffffffffff190 = (CBlockHeaderAndShortTxIDs *)(local_5f0 + 0x60);
    in_stack_fffffffffffff188 = "block.GetHash().ToString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_a58,local_a68,0x100,1,2,local_550);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff188);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff188);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff188);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff198,
               (pointer)in_stack_fffffffffffff190,(unsigned_long)in_stack_fffffffffffff188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff1cf,in_stack_fffffffffffff1c8),
               (const_string *)in_stack_fffffffffffff1c0,(size_t)in_stack_fffffffffffff1b8,
               (const_string *)CONCAT17(in_stack_fffffffffffff1b7,in_stack_fffffffffffff1b0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff190,(char (*) [1])in_stack_fffffffffffff188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff198,
               (pointer)in_stack_fffffffffffff190,(unsigned_long)in_stack_fffffffffffff188);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff190);
    BlockMerkleRoot(in_stack_fffffffffffff1e8,(bool *)in_stack_fffffffffffff1e0);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff190);
    in_stack_fffffffffffff198 = "BlockMerkleRoot(block2, &mutated).ToString()";
    in_stack_fffffffffffff190 = (CBlockHeaderAndShortTxIDs *)local_5f0;
    in_stack_fffffffffffff188 = "block.hashMerkleRoot.ToString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_ab0,local_ac0,0x102,1,2,local_5f0 + 0x20);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff188);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff188);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff188);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff198,
               (pointer)in_stack_fffffffffffff190,(unsigned_long)in_stack_fffffffffffff188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff1cf,in_stack_fffffffffffff1c8),
               (const_string *)in_stack_fffffffffffff1c0,(size_t)in_stack_fffffffffffff1b8,
               (const_string *)CONCAT17(in_stack_fffffffffffff1b7,in_stack_fffffffffffff1b0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff198,
               SUB81((ulong)in_stack_fffffffffffff190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff198,
               (pointer)in_stack_fffffffffffff190,(unsigned_long)in_stack_fffffffffffff188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff190,
               (basic_cstring<const_char> *)in_stack_fffffffffffff188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff198,
               (pointer)in_stack_fffffffffffff190,(unsigned_long)in_stack_fffffffffffff188);
    in_stack_fffffffffffff188 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_af8,local_b18,local_b38,0x103,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff188);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_fffffffffffff198,(size_type)in_stack_fffffffffffff190);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffff188);
  CTransaction::GetHash((CTransaction *)in_stack_fffffffffffff188);
  puVar5 = transaction_identifier::operator_cast_to_uint256_
                     ((transaction_identifier<false> *)in_stack_fffffffffffff188);
  local_250 = *(undefined8 *)(puVar5->super_base_blob<256U>).m_data._M_elems;
  local_248 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 8);
  local_240 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
  local_238 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x18);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::clear((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)in_stack_fffffffffffff188);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::clear((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)in_stack_fffffffffffff188);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff198,
               (pointer)in_stack_fffffffffffff190,(unsigned_long)in_stack_fffffffffffff188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff1cf,in_stack_fffffffffffff1c8),
               (const_string *)in_stack_fffffffffffff1c0,(size_t)in_stack_fffffffffffff1b8,
               (const_string *)CONCAT17(in_stack_fffffffffffff1b7,in_stack_fffffffffffff1b0));
    this_00 = (CTxMemPool *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff190,(char (*) [1])in_stack_fffffffffffff188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff198,
               (pointer)in_stack_fffffffffffff190,(unsigned_long)in_stack_fffffffffffff188);
    CTxMemPool::get(this_00,(uint256 *)CONCAT17(in_stack_fffffffffffff1cf,in_stack_fffffffffffff1c8)
                   );
    local_b90 = (pointer)std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::
                         use_count((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                                   in_stack_fffffffffffff188);
    local_c18[0x70] = '\x04';
    local_c18[0x71] = '\0';
    local_c18[0x72] = '\0';
    local_c18[0x73] = '\0';
    local_c18[0x74] = '\0';
    local_c18[0x75] = '\0';
    local_c18[0x76] = '\0';
    local_c18[0x77] = '\0';
    in_stack_fffffffffffff198 = "SHARED_TX_OFFSET + 1 - 1";
    in_stack_fffffffffffff190 = (CBlockHeaderAndShortTxIDs *)(local_c18 + 0x70);
    in_stack_fffffffffffff188 = "pool.get(txhash).use_count()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_b78,local_b88,0x108,1,2,&local_b90);
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffff188);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff188);
    in_stack_fffffffffffff1cf = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff1cf);
  PartiallyDownloadedBlock::~PartiallyDownloadedBlock
            ((PartiallyDownloadedBlock *)in_stack_fffffffffffff188);
  CBlock::~CBlock((CBlock *)in_stack_fffffffffffff188);
  PartiallyDownloadedBlock::~PartiallyDownloadedBlock
            ((PartiallyDownloadedBlock *)in_stack_fffffffffffff188);
  CBlockHeaderAndShortTxIDs::~CBlockHeaderAndShortTxIDs
            ((CBlockHeaderAndShortTxIDs *)in_stack_fffffffffffff188);
  DataStream::~DataStream((DataStream *)in_stack_fffffffffffff188);
  TestHeaderAndShortIDs::~TestHeaderAndShortIDs((TestHeaderAndShortIDs *)in_stack_fffffffffffff188);
  do {
    pcVar8 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff198,
               (pointer)in_stack_fffffffffffff190,(unsigned_long)in_stack_fffffffffffff188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff1cf,in_stack_fffffffffffff1c8),
               pcVar8,(size_t)in_stack_fffffffffffff1b8,
               (const_string *)CONCAT17(in_stack_fffffffffffff1b7,in_stack_fffffffffffff1b0));
    in_stack_fffffffffffff1b8 =
         (PartiallyDownloadedBlock *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff190,(char (*) [1])in_stack_fffffffffffff188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff198,
               (pointer)in_stack_fffffffffffff190,(unsigned_long)in_stack_fffffffffffff188);
    CTxMemPool::get(this_00,(uint256 *)CONCAT17(in_stack_fffffffffffff1cf,in_stack_fffffffffffff1c8)
                   );
    local_c18._24_8_ =
         std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::use_count
                   ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                    in_stack_fffffffffffff188);
    local_c18._0_8_ = 3;
    in_stack_fffffffffffff198 = "SHARED_TX_OFFSET - 1";
    in_stack_fffffffffffff190 = (CBlockHeaderAndShortTxIDs *)local_c18;
    in_stack_fffffffffffff188 = "pool.get(txhash).use_count()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_c18 + 0x30,local_c18 + 0x20,0x10a,1,2,local_c18 + 0x18);
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffff188);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff188);
    in_stack_fffffffffffff1b7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff1b7);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff188);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff188);
  CBlock::~CBlock((CBlock *)in_stack_fffffffffffff188);
  FastRandomContext::~FastRandomContext((FastRandomContext *)in_stack_fffffffffffff188);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(SufficientPreforwardRTTest)
{
    CTxMemPool& pool = *Assert(m_node.mempool);
    TestMemPoolEntryHelper entry;
    auto rand_ctx(FastRandomContext(uint256{42}));
    CBlock block(BuildBlockTestCase(rand_ctx));

    LOCK2(cs_main, pool.cs);
    pool.addUnchecked(entry.FromTx(block.vtx[1]));
    BOOST_CHECK_EQUAL(pool.get(block.vtx[1]->GetHash()).use_count(), SHARED_TX_OFFSET + 0);

    uint256 txhash;

    // Test with pre-forwarding coinbase + tx 2 with tx 1 in mempool
    {
        TestHeaderAndShortIDs shortIDs(block, rand_ctx);
        shortIDs.prefilledtxn.resize(2);
        shortIDs.prefilledtxn[0] = {0, block.vtx[0]};
        shortIDs.prefilledtxn[1] = {1, block.vtx[2]}; // id == 1 as it is 1 after index 1
        shortIDs.shorttxids.resize(1);
        shortIDs.shorttxids[0] = shortIDs.GetShortID(block.vtx[1]->GetWitnessHash());

        DataStream stream{};
        stream << shortIDs;

        CBlockHeaderAndShortTxIDs shortIDs2;
        stream >> shortIDs2;

        PartiallyDownloadedBlock partialBlock(&pool);
        BOOST_CHECK(partialBlock.InitData(shortIDs2, empty_extra_txn) == READ_STATUS_OK);
        BOOST_CHECK( partialBlock.IsTxAvailable(0));
        BOOST_CHECK( partialBlock.IsTxAvailable(1));
        BOOST_CHECK( partialBlock.IsTxAvailable(2));

        BOOST_CHECK_EQUAL(pool.get(block.vtx[1]->GetHash()).use_count(), SHARED_TX_OFFSET + 1);

        CBlock block2;
        PartiallyDownloadedBlock partialBlockCopy = partialBlock;
        BOOST_CHECK(partialBlock.FillBlock(block2, {}) == READ_STATUS_OK);
        BOOST_CHECK_EQUAL(block.GetHash().ToString(), block2.GetHash().ToString());
        bool mutated;
        BOOST_CHECK_EQUAL(block.hashMerkleRoot.ToString(), BlockMerkleRoot(block2, &mutated).ToString());
        BOOST_CHECK(!mutated);

        txhash = block.vtx[1]->GetHash();
        block.vtx.clear();
        block2.vtx.clear();
        BOOST_CHECK_EQUAL(pool.get(txhash).use_count(), SHARED_TX_OFFSET + 1 - 1); // + 1 because of partialBlock; -1 because of block.
    }
    BOOST_CHECK_EQUAL(pool.get(txhash).use_count(), SHARED_TX_OFFSET - 1); // -1 because of block
}